

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::visitStructNew(OptimizeInstructions *this,StructNew *curr)

{
  Id IVar1;
  pointer pFVar2;
  PassRunner *pPVar3;
  Module *module;
  element_type *peVar4;
  OptimizeInstructions *pOVar5;
  bool bVar6;
  element_type *curr_00;
  Expression **ppEVar7;
  Expression *rep;
  pointer pFVar8;
  ulong uVar9;
  Literal local_80;
  anon_union_16_6_1532cd5a_for_Literal_0 local_68;
  Struct *local_50;
  StructNew *local_48;
  OptimizeInstructions *local_40;
  Type local_38;
  Type type;
  
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id != 1) &&
     ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0)) {
    local_68.i64 = (int64_t)wasm::Type::getHeapType
                                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).
                                        super_Expression.type);
    local_50 = HeapType::getStruct((HeapType *)&local_68.func);
    pFVar8 = (local_50->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (local_50->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)pFVar2 - (long)pFVar8 >> 4 !=
        (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements) {
      __assert_fail("fields.size() == curr->operands.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x726,"void wasm::OptimizeInstructions::visitStructNew(StructNew *)");
    }
    if (pFVar2 != pFVar8) {
      uVar9 = 0;
      local_48 = curr;
      local_40 = this;
      do {
        pOVar5 = local_40;
        local_38.id = pFVar8[uVar9].type.id;
        bVar6 = wasm::Type::isDefaultable(&local_38);
        if (!bVar6) {
          return;
        }
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar9) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pPVar3 = (pOVar5->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner;
        module = (pOVar5->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule;
        peVar4 = (element_type *)
                 (curr->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                 [uVar9];
        do {
          curr_00 = peVar4;
          local_68.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               curr_00;
          ppEVar7 = Properties::getImmediateFallthroughPtr
                              ((Expression **)&local_68.i64,&pPVar3->options,module,AllowTeeBrIf);
          peVar4 = (element_type *)*ppEVar7;
        } while ((element_type *)*ppEVar7 != curr_00);
        IVar1 = *(Id *)&(curr_00->type).id;
        peVar4 = curr_00;
        while (IVar1 == RefAsId) {
          if (1 < (peVar4->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
                  i32 - 1U) {
            return;
          }
          peVar4 = (element_type *)
                   (peVar4->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
                   gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          IVar1 = *(Id *)&(peVar4->type).id;
        }
        if (((0x2a < IVar1 - 0x29) || ((0x40000000005U >> ((ulong)(IVar1 - 0x29) & 0x3f) & 1) == 0))
           && (IVar1 != ConstId)) {
          return;
        }
        Properties::getLiteral((Literal *)&local_68.func,(Expression *)curr_00);
        Literal::makeZero(&local_80,local_38);
        bVar6 = Literal::operator!=((Literal *)&local_68.func,&local_80);
        curr = local_48;
        Literal::~Literal(&local_80);
        Literal::~Literal((Literal *)&local_68.func);
        if (bVar6) {
          return;
        }
        uVar9 = (ulong)((int)uVar9 + 1);
        pFVar8 = (local_50->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        this = local_40;
      } while (uVar9 < (ulong)((long)(local_50->fields).
                                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pFVar8 >> 4))
      ;
    }
    rep = wasm::getDroppedChildrenAndAppend
                    ((Expression *)curr,
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                     ).
                     super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                     .
                     super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                     .currModule,
                     &((this->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).super_Pass.runner)->options,(Expression *)curr,NoticeParentEffects);
    (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    replaceCurrent(this,rep);
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    // If values are provided, but they are all the default, then we can remove
    // them (in reachable code).
    if (curr->type == Type::unreachable || curr->isWithDefault()) {
      return;
    }

    const auto& fields = curr->type.getHeapType().getStruct().fields;
    assert(fields.size() == curr->operands.size());

    for (Index i = 0; i < fields.size(); i++) {
      // The field must be defaultable.
      auto type = fields[i].type;
      if (!type.isDefaultable()) {
        return;
      }

      // The field must be written the default value.
      auto* value = getFallthrough(curr->operands[i]);
      if (!Properties::isSingleConstantExpression(value) ||
          Properties::getLiteral(value) != Literal::makeZero(type)) {
        return;
      }
    }

    // Success! Drop the children and return a struct.new_with_default.
    auto* rep = getDroppedChildrenAndAppend(curr, curr);
    curr->operands.clear();
    assert(curr->isWithDefault());
    replaceCurrent(rep);
  }